

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht.c
# Opt level: O3

int lgx_ht_init(lgx_ht_t *ht,uint size)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  lgx_ht_node_t **pplVar4;
  
  ht->head = (lgx_ht_node_t *)0x0;
  ht->tail = (lgx_ht_node_t *)0x0;
  ht->size = 0;
  ht->length = 0;
  ht->table = (lgx_ht_node_t **)0x0;
  iVar1 = 0x1f;
  if (size - 1 != 0) {
    for (; size - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  uVar3 = 0x100000000 >> (((byte)iVar1 ^ 0x1f) & 0x3f);
  uVar2 = 8;
  if (8 < (uint)uVar3) {
    uVar2 = uVar3;
  }
  pplVar4 = (lgx_ht_node_t **)calloc(uVar2 & 0xffffffff,8);
  ht->table = pplVar4;
  if (pplVar4 != (lgx_ht_node_t **)0x0) {
    ht->length = 0;
    ht->size = (uint)uVar2;
  }
  return (uint)(pplVar4 == (lgx_ht_node_t **)0x0);
}

Assistant:

int lgx_ht_init(lgx_ht_t* ht, unsigned size) {
    memset(ht, 0, sizeof(lgx_ht_t));
    
    // 规范化 size 取值
    size = ALIGN(size);
    if (size < LGX_HT_MIN_SIZE) {
        size = LGX_HT_MIN_SIZE;
    }

    ht->table = (lgx_ht_node_t **)xcalloc(size, sizeof(lgx_ht_node_t*));
    if (UNEXPECTED(!ht->table)) {
        return 1;
    }

    ht->length = 0;
    ht->size = size;

    return 0;
}